

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

void Gia_ObjComputeTruthTableStop(Gia_Man_t *p)

{
  int *piVar1;
  void **__ptr;
  word *__ptr_00;
  
  p->nTtVars = 0;
  p->nTtWords = 0;
  if (p->vTtNums != (Vec_Int_t *)0x0) {
    piVar1 = p->vTtNums->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTtNums->pArray = (int *)0x0;
    }
    if (p->vTtNums != (Vec_Int_t *)0x0) {
      free(p->vTtNums);
      p->vTtNums = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTtNodes != (Vec_Int_t *)0x0) {
    piVar1 = p->vTtNodes->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTtNodes->pArray = (int *)0x0;
    }
    if (p->vTtNodes != (Vec_Int_t *)0x0) {
      free(p->vTtNodes);
      p->vTtNodes = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTtInputs != (Vec_Ptr_t *)0x0) {
    __ptr = p->vTtInputs->pArray;
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->vTtInputs->pArray = (void **)0x0;
    }
    if (p->vTtInputs != (Vec_Ptr_t *)0x0) {
      free(p->vTtInputs);
      p->vTtInputs = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vTtMemory != (Vec_Wrd_t *)0x0) {
    __ptr_00 = p->vTtMemory->pArray;
    if (__ptr_00 != (word *)0x0) {
      free(__ptr_00);
      p->vTtMemory->pArray = (word *)0x0;
    }
    if (p->vTtMemory != (Vec_Wrd_t *)0x0) {
      free(p->vTtMemory);
      p->vTtMemory = (Vec_Wrd_t *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_ObjComputeTruthTableStop( Gia_Man_t * p )
{
    p->nTtVars   = 0;
    p->nTtWords  = 0;
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_WrdFreeP( &p->vTtMemory );
}